

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nibbler.cpp
# Opt level: O0

bool __thiscall Nibbler::getUnsignedNumber(Nibbler *this,double *result)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  float fVar4;
  string local_68 [32];
  string local_48 [32];
  ulong local_28;
  size_type i;
  double *result_local;
  Nibbler *this_local;
  
  local_28 = this->_cursor;
  if (local_28 < this->_length) {
    i = (size_type)result;
    result_local = (double *)this;
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)this);
    iVar1 = isdigit((int)*pcVar2);
    if (iVar1 != 0) {
      do {
        local_28 = local_28 + 1;
        bVar3 = false;
        if (local_28 < this->_length) {
          pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)this);
          iVar1 = isdigit((int)*pcVar2);
          bVar3 = iVar1 != 0;
        }
      } while (bVar3);
      if ((local_28 < this->_length) &&
         (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)this), *pcVar2 == '.')) {
        do {
          local_28 = local_28 + 1;
          bVar3 = false;
          if (local_28 < this->_length) {
            pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)this);
            iVar1 = isdigit((int)*pcVar2);
            bVar3 = iVar1 != 0;
          }
        } while (bVar3);
      }
      if ((local_28 < this->_length) &&
         ((pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)this), *pcVar2 == 'e' ||
          (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)this), *pcVar2 == 'E')))) {
        local_28 = local_28 + 1;
        if ((local_28 < this->_length) &&
           ((pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)this), *pcVar2 == '+' ||
            (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)this), *pcVar2 == '-')))) {
          local_28 = local_28 + 1;
        }
        if (local_28 < this->_length) {
          pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)this);
          iVar1 = isdigit((int)*pcVar2);
          if (iVar1 != 0) {
            do {
              local_28 = local_28 + 1;
              bVar3 = false;
              if (local_28 < this->_length) {
                pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)this);
                iVar1 = isdigit((int)*pcVar2);
                bVar3 = iVar1 != 0;
              }
            } while (bVar3);
            std::__cxx11::string::substr((ulong)local_48,(ulong)this);
            pcVar2 = (char *)std::__cxx11::string::c_str();
            fVar4 = strtof(pcVar2,(char **)0x0);
            *(double *)i = (double)fVar4;
            std::__cxx11::string::~string(local_48);
            this->_cursor = local_28;
            return true;
          }
        }
        return false;
      }
      std::__cxx11::string::substr((ulong)local_68,(ulong)this);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      fVar4 = strtof(pcVar2,(char **)0x0);
      *(double *)i = (double)fVar4;
      std::__cxx11::string::~string(local_68);
      this->_cursor = local_28;
      return true;
    }
  }
  return false;
}

Assistant:

bool Nibbler::getUnsignedNumber (double& result)
{
  std::string::size_type i = _cursor;

  // digit+
  if (i < _length && isdigit (_input[i]))
  {
    ++i;

    while (i < _length && isdigit (_input[i]))
      ++i;

    // ( . digit+ )?
    if (i < _length && _input[i] == '.')
    {
      ++i;

      while (i < _length && isdigit (_input[i]))
        ++i;
    }

    // ( [eE] [+-]? digit+ )?
    if (i < _length && (_input[i] == 'e' || _input[i] == 'E'))
    {
      ++i;

      if (i < _length && (_input[i] == '+' || _input[i] == '-'))
        ++i;

      if (i < _length && isdigit (_input[i]))
      {
        ++i;

        while (i < _length && isdigit (_input[i]))
          ++i;

        result = strtof (_input.substr (_cursor, i - _cursor).c_str (), NULL);
        _cursor = i;
        return true;
      }

      return false;
    }

    result = strtof (_input.substr (_cursor, i - _cursor).c_str (), NULL);
    _cursor = i;
    return true;
  }

  return false;
}